

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QCommonArrayOps<QString>::appendIteratorRange<QSet<QString>::const_iterator>
          (QCommonArrayOps<QString> *this,const_iterator b,const_iterator e,
          IfIsForwardIterator<QSet<QString>::const_iterator> param_3)

{
  qsizetype *pqVar1;
  QArrayDataPointer<char16_t> *other;
  Data<QHashPrivate::Node<QString,_QHashDummyValue>_> *this_00;
  QArrayDataPointer<char16_t> *this_01;
  long in_FS_OFFSET;
  const_iterator __first;
  const_iterator __last;
  long local_48;
  size_t sStack_40;
  undefined8 local_38;
  size_t sStack_30;
  size_t local_28;
  
  __last.i.i.bucket = e.i.i.d;
  __last.i.i.d = b.i.i.bucket;
  this_00 = b.i.i.d;
  local_28 = *(size_t *)(in_FS_OFFSET + 0x28);
  local_38._0_4_ = (this_00->ref).atomic;
  local_38._4_4_ = *(undefined4 *)&this_00->field_0x4;
  sStack_30 = this_00->size;
  local_48 = *(long *)__last.i.i.d;
  sStack_40 = (__last.i.i.d)->size;
  __first.i.i.bucket = (size_t)&local_48;
  __first.i.i.d = (Data<QHashPrivate::Node<QString,_QHashDummyValue>_> *)&local_38;
  std::distance<QSet<QString>::const_iterator>(__first,__last);
  this_01 = &(this->super_Type).super_QGenericArrayOps<QString>.super_QArrayDataPointer<QString>.ptr
             [(this->super_Type).super_QGenericArrayOps<QString>.super_QArrayDataPointer<QString>.
              size].d;
  while ((*(long *)this_00 != *(long *)__last.i.i.d || (this_00->size != (__last.i.i.d)->size))) {
    other = (QArrayDataPointer<char16_t> *)
            QHashPrivate::iterator<QHashPrivate::Node<QString,_QHashDummyValue>_>::node
                      ((iterator<QHashPrivate::Node<QString,_QHashDummyValue>_> *)this_00);
    QArrayDataPointer<char16_t>::QArrayDataPointer(this_01,other);
    pqVar1 = &(this->super_Type).super_QGenericArrayOps<QString>.super_QArrayDataPointer<QString>.
              size;
    *pqVar1 = *pqVar1 + 1;
    this_01 = this_01 + 1;
    QHashPrivate::iterator<QHashPrivate::Node<QString,_QHashDummyValue>_>::operator++
              ((iterator<QHashPrivate::Node<QString,_QHashDummyValue>_> *)this_00);
  }
  if (*(size_t *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void appendIteratorRange(It b, It e, QtPrivate::IfIsForwardIterator<It> = true)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        const qsizetype distance = std::distance(b, e);
        Q_ASSERT(distance >= 0 && distance <= this->allocatedCapacity() - this->size);
        Q_UNUSED(distance);

#if __cplusplus >= 202002L && defined(__cpp_concepts) && defined(__cpp_lib_concepts)
        constexpr bool canUseCopyAppend =
                std::contiguous_iterator<It> &&
                std::is_same_v<
                    std::remove_cv_t<typename std::iterator_traits<It>::value_type>,
                    T
                >;
        if constexpr (canUseCopyAppend) {
            this->copyAppend(std::to_address(b), std::to_address(e));
        } else
#endif
        {
            T *iter = this->end();
            for (; b != e; ++iter, ++b) {
                new (iter) T(*b);
                ++this->size;
            }
        }
    }